

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O0

void __thiscall
ImportFragment_BadInternalFixupTargetSection_Test::TestBody
          (ImportFragment_BadInternalFixupTargetSection_Test *this)

{
  bool bVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  char *pcVar2;
  error_code *lhs;
  char *in_R9;
  error_code eVar3;
  AssertHelper local_248;
  Message local_240;
  error_code local_238;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> parser;
  string_mapping imported_names;
  digest fragment_digest;
  unique_lock<mock_mutex> local_80;
  undefined1 local_70 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_30 [7];
  mock_mutex mutex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  ImportFragment_BadInternalFixupTargetSection_Test *this_local;
  
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               "{\n        \"text\": {\n            \"data\":\"\",\n            \"ifixups\":[ { \"section\":\"data\", \"type\":1, \"offset\":0, \"addend\":0 } ]\n        }\n    }"
               ,0x8b);
  std::unique_lock<mock_mutex>::unique_lock(&local_80,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_70,
          &(this->super_ImportFragment).import_db_,&local_80);
  std::unique_lock<mock_mutex>::~unique_lock(&local_80);
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x11111111;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)&parser.coordinate_)
  ;
  anon_unknown.dwarf_1822fc::import_fragment_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (transaction *)local_70,(string_mapping *)&parser.coordinate_,
             (digest *)&imported_names.lookup_._M_h._M_single_bucket);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
                       (string *)local_30);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_1e1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1e0,(AssertionResult *)0x2ecd1e,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_fragment.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  lhs = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                  ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  eVar3 = pstore::exchange::import_ns::make_error_code(internal_fixup_target_not_found);
  local_238._M_cat = eVar3._M_cat;
  local_238._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_228,"parser.last_error ()",
             "make_error_code (error::internal_fixup_target_not_found)",lhs,&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_fragment.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  pstore::exchange::import_ns::string_mapping::~string_mapping
            ((string_mapping *)&parser.coordinate_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_70);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (ImportFragment, BadInternalFixupTargetSection) {
    using namespace pstore::exchange::import_ns;

    // This fragment contains a text section only but it has an internal fixup that targets the
    // data section. The fragment should be rejected.
    auto const input = R"({
        "text": {
            "data":"",
            "ifixups":[ { "section":"data", "type":1, "offset":0, "addend":0 } ]
        }
    })"s;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    constexpr pstore::index::digest fragment_digest{0x11111111, 0x11111111};
    string_mapping imported_names;

    auto parser = import_fragment_parser (&transaction, &imported_names, &fragment_digest);
    parser.input (input).eof ();
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (), make_error_code (error::internal_fixup_target_not_found));
}